

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDAGetDky(void *ida_mem,sunrealtype t,int k,N_Vector dky)

{
  double dVar1;
  int iVar2;
  long lVar3;
  sunrealtype *psVar4;
  long lVar5;
  long lVar6;
  int error_code;
  char *msgfmt;
  sunrealtype *psVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uStack_a0;
  sunrealtype cjk [6];
  sunrealtype cjk_1 [6];
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0xc1c;
  }
  else if (dky == (N_Vector)0x0) {
    msgfmt = "dky = NULL illegal.";
    error_code = -0x1b;
    iVar2 = 0xc25;
  }
  else {
    if ((-1 < k) &&
       (uStack_a0._4_4_ = *(int *)((long)ida_mem + 0x4bc) - k, k <= *(int *)((long)ida_mem + 0x4bc))
       ) {
      dVar1 = *(double *)((long)ida_mem + 0x4f8);
      dVar9 = *(double *)((long)ida_mem + 0x4e0);
      dVar11 = (ABS(dVar9) + ABS(dVar1)) * *(double *)((long)ida_mem + 8) * 100.0;
      if ((t - ((dVar1 - *(double *)((long)ida_mem + 0x4e8)) -
               (double)(-(ulong)(dVar9 < 0.0) & (ulong)-dVar11 |
                       ~-(ulong)(dVar9 < 0.0) & (ulong)dVar11))) * dVar9 < 0.0) {
        IDAProcessError((IDAMem)ida_mem,-0x1a,0xc3a,"IDAGetDky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                        ,
                        "Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg."
                       );
        return -0x1a;
      }
      for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
        cjk[lVar3] = 0.0;
        cjk_1[lVar3] = 0.0;
      }
      psVar7 = cjk_1;
      iVar2 = 1;
      psVar4 = cjk;
      uVar8 = 0;
      lVar3 = 0x100000000;
      while( true ) {
        psVar7 = psVar7 + 1;
        psVar4 = psVar4 + 1;
        if (uVar8 == k + 1) break;
        if (uVar8 == 0) {
          cjk[0] = 1.0;
          dVar11 = 0.0;
          dVar9 = 0.0;
        }
        else {
          dVar11 = (double)(int)uVar8;
          dVar9 = *(double *)((long)ida_mem + uVar8 * 8 + 0x180);
          cjk[uVar8] = ((double)(&uStack_a0)[uVar8] * dVar11) / dVar9;
        }
        for (lVar5 = (long)iVar2; lVar5 <= (long)(uVar8 + (long)uStack_a0._4_4_); lVar5 = lVar5 + 1)
        {
          dVar10 = dVar9 + (t - dVar1);
          dVar9 = *(double *)((long)ida_mem + lVar5 * 8 + 0x180);
          cjk[lVar5] = (cjk[lVar5 + 5] * dVar11 + dVar10 * (double)(&uStack_a0)[lVar5]) / dVar9;
        }
        lVar6 = 0;
        for (lVar5 = lVar3; lVar5 >> 0x20 <= (long)(uVar8 + (long)uStack_a0._4_4_);
            lVar5 = lVar5 + 0x100000000) {
          *(undefined8 *)((long)psVar7 + lVar6) = *(undefined8 *)((long)psVar4 + lVar6);
          lVar6 = lVar6 + 8;
        }
        uVar8 = uVar8 + 1;
        iVar2 = iVar2 + 1;
        lVar3 = lVar3 + 0x100000000;
      }
      iVar2 = N_VLinearCombination
                        (uStack_a0._4_4_ + 1,cjk + (uint)k,
                         (long)ida_mem + (ulong)(uint)k * 8 + 0x158,dky);
      if (iVar2 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "Illegal value for k.";
    error_code = -0x19;
    iVar2 = 0xc2d;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDAGetDky",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAGetDky(void* ida_mem, sunrealtype t, int k, N_Vector dky)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (dky == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kused))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround *
          (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));
  if (IDA_mem->ida_hh < ZERO) { tfuzz = -tfuzz; }
  tp = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }

  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    /* The below reccurence is used to compute the k-th derivative of the solution:
       c_j^(k) = ( k * c_{j-1}^(k-1) + c_{j-1}^{k} (Delta+psi_{j-1}) ) / psi_j

       Translated in indexes notation:
       cjk[j] = ( k*cjk_1[j-1] + cjk[j-1]*(delt+psi[j-2]) ) / psi[j-1]

       For k=0, j=1: c_1 = c_0^(-1) + (delt+psi[-1]) / psi[0]

       In order to be able to deal with k=0 in the same way as for k>0, the
       following conventions were adopted:
         - c_0(t) = 1 , c_0^(-1)(t)=0
         - psij_1 stands for psi[-1]=0 when j=1
                         for psi[j-2]  when j>1
    */
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      /*                                                i       i-1          1
        c_i^(i) can be always updated since c_i^(i) = -----  --------  ... -----
                                                      psi_j  psi_{j-1}     psi_1
      */
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */

    /*j does not need to go till kused */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  /* Sum j=k to j<=IDA_mem->ida_kused */
  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phi + k, dky);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}